

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Writer.cpp
# Opt level: O1

h__AS02WriterFrame * __thiscall
AS_02::h__AS02WriterFrame::WriteEKLVPacket
          (h__AS02WriterFrame *this,FrameBuffer *FrameBuf,byte_t *EssenceUL,
          ui32_t *MinEssenceElementBerLength,AESEncContext *Ctx,HMACContext *HMAC)

{
  uint uVar1;
  ui32_t uVar2;
  byte_t *pbVar3;
  _List_node_base *p_Var4;
  Dictionary *pDVar5;
  int64_t tmp_pos;
  UL body_ul;
  Result_t local_228 [104];
  Partition body_part;
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  local_d0 [56];
  
  pDVar5 = (Dictionary *)(FrameBuf + 0x10);
  ASDCP::Write_EKLV_Packet
            ((FileWriter *)this,pDVar5,*(OP1aHeader **)(FrameBuf + 8),
             (WriterInfo *)(FrameBuf + 0x50),FrameBuf + 0x378,(uint *)(FrameBuf + 0x348),
             (ulonglong *)(FrameBuf + 0x338),FrameBuf + 0x340,EssenceUL,MinEssenceElementBerLength,
             Ctx,HMAC);
  if (-1 < *(int *)&(this->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                    super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
    _body_part = ASDCP::MXF::Partition::WriteToFile;
    MXF::AS02IndexWriterVBR::PushIndexEntry
              ((AS02IndexWriterVBR *)(FrameBuf + 0x448),(IndexEntry *)&body_part);
  }
  uVar1 = *(uint *)(FrameBuf + 0x338);
  if ((1 < uVar1) && ((uVar1 + 1) % *(uint *)(FrameBuf + 0x440) == 0)) {
    uVar2 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(FrameBuf + 0x448));
    if (uVar2 == 0) {
      __assert_fail("m_IndexWriter.GetDuration() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Writer.cpp"
                    ,0xd6,
                    "Result_t AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer &, const byte_t *, const ui32_t &, AESEncContext *, HMACContext *)"
                   );
    }
    h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
              ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(FrameBuf + 8));
    body_ul.super_Identifier<16U>.m_HasValue = true;
    body_ul.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar3;
    body_ul.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar3 + 8);
    body_ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0016cc90;
    ASDCP::MXF::Partition::Partition(&body_part,*(Dictionary **)(FrameBuf + 8));
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=(local_d0,(_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                          *)(FrameBuf + 0x140));
    (**(code **)(*(long *)pDVar5 + 0x30))(local_228,pDVar5,&tmp_pos);
    Kumu::Result_t::~Result_t(local_228);
    ASDCP::MXF::Partition::WriteToFile((FileWriter *)local_228,(UL *)&body_part);
    Kumu::Result_t::operator=((Result_t *)this,local_228);
    Kumu::Result_t::~Result_t(local_228);
    p_Var4 = (_List_node_base *)operator_new(0x28);
    p_Var4[1]._M_next = (_List_node_base *)&PTR__IArchive_0016ce10;
    *(undefined4 *)&p_Var4[1]._M_prev = 1;
    p_Var4[2]._M_next = (_List_node_base *)tmp_pos;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    *(long *)(FrameBuf + 0x2f8) = *(long *)(FrameBuf + 0x2f8) + 1;
    ASDCP::MXF::Partition::~Partition(&body_part);
  }
  return this;
}

Assistant:

Result_t
AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer& FrameBuf,const byte_t* EssenceUL,
					   const ui32_t& MinEssenceElementBerLength,
					   AESEncContext* Ctx, HMACContext* HMAC)
{
  ui64_t this_stream_offset = m_StreamOffset; // m_StreamOffset will be changed by the call to Write_EKLV_Packet

  Result_t result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				      m_StreamOffset, FrameBuf, EssenceUL, MinEssenceElementBerLength, Ctx, HMAC);

  if ( KM_SUCCESS(result) )
    {  
      IndexTableSegment::IndexEntry Entry;
      Entry.StreamOffset = this_stream_offset;
      m_IndexWriter.PushIndexEntry(Entry);
    }

  if ( m_FramesWritten > 1 && ( ( m_FramesWritten + 1 ) % m_PartitionSpace ) == 0 )
    {
      assert(m_IndexWriter.GetDuration() > 0);
      FlushIndexPartition();

      UL body_ul(m_Dict->ul(MDD_ClosedCompleteBodyPartition));
      Partition body_part(m_Dict);
      body_part.MajorVersion = m_HeaderPart.MajorVersion;
      body_part.MinorVersion = m_HeaderPart.MinorVersion;
      body_part.BodySID = 1;
      body_part.OperationalPattern = m_HeaderPart.OperationalPattern;
      body_part.EssenceContainers = m_HeaderPart.EssenceContainers;
      body_part.ThisPartition = m_File.TellPosition();

      body_part.BodyOffset = m_StreamOffset;
      result = body_part.WriteToFile(m_File, body_ul);
      m_RIP.PairArray.push_back(RIP::PartitionPair(1, body_part.ThisPartition));
    }

  return result;
}